

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O1

void __thiscall
DListBase<Memory::ArenaData_*,_RealCount>::EditingIterator::
RemoveCurrent<Memory::NoThrowHeapAllocator>(EditingIterator *this,NoThrowHeapAllocator *allocator)

{
  RealCount *pRVar1;
  NodeBase *buffer;
  DListNodeBase<Memory::ArenaData_*> *pDVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  
  if ((this->super_Iterator).current == (NodeBase *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x94,"(this->current != nullptr)","this->current != nullptr");
    if (!bVar4) goto LAB_003a8a0b;
    *puVar5 = 0;
  }
  if ((DListBase<Memory::ArenaData_*,_RealCount> *)(this->super_Iterator).current ==
      (this->super_Iterator).list) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x95,"(!this->list->IsHead(this->current))",
                       "!this->list->IsHead(this->current)");
    if (!bVar4) {
LAB_003a8a0b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  buffer = (this->super_Iterator).current;
  pDVar2 = (buffer->prev).base;
  pDVar2->next = buffer->next;
  ((buffer->next).base)->prev = buffer->prev;
  Memory::NoThrowHeapAllocator::Free(allocator,buffer,0x18);
  (this->super_Iterator).current = pDVar2;
  pRVar1 = &((this->super_Iterator).list)->super_RealCount;
  pRVar1->count = pRVar1->count - 1;
  return;
}

Assistant:

void RemoveCurrent(TAllocator * allocator)
        {
            Assert(this->current != nullptr);
            Assert(!this->list->IsHead(this->current));

            NodeBase * last = this->current->Prev();
            NodeBase * node = const_cast<NodeBase *>(this->current);
            DListBase::RemoveNode(node);
            AllocatorDelete(TAllocator, allocator, (Node *)node);
            this->current = last;
            const_cast<DListBase *>(this->list)->DecrementCount();
        }